

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlFreeNodeList(xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlDocPtr pxVar2;
  xmlDocPtr pxVar3;
  _xmlDtd *p_Var4;
  _xmlDtd *p_Var5;
  int iVar6;
  xmlDeregisterNodeFunc *pp_Var7;
  long lVar8;
  xmlDictPtr local_38;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  if (cur->type == XML_NAMESPACE_DECL) {
    xmlFreeNsList((xmlNsPtr)cur);
    return;
  }
  if (cur->doc == (_xmlDoc *)0x0) {
    local_38 = (xmlDictPtr)0x0;
  }
  else {
    local_38 = cur->doc->dict;
  }
  lVar8 = 0;
  do {
    pxVar2 = (xmlDocPtr)((xmlDocPtr)cur)->children;
    while ((pxVar3 = pxVar2, pxVar3 != (xmlDocPtr)0x0 &&
           ((XML_DTD_NODE < ((xmlDocPtr)cur)->type ||
            ((0x6220U >> (((xmlDocPtr)cur)->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)
            )))) {
      lVar8 = lVar8 + 1;
      pxVar2 = (xmlDocPtr)pxVar3->children;
      cur = (xmlNodePtr)pxVar3;
    }
    pxVar2 = (xmlDocPtr)((xmlDocPtr)cur)->next;
    pxVar3 = (xmlDocPtr)((xmlDocPtr)cur)->parent;
    xVar1 = ((xmlDocPtr)cur)->type;
    if (xVar1 == XML_DOCUMENT_NODE) {
LAB_0018299e:
      xmlFreeDoc((xmlDocPtr)cur);
    }
    else if (xVar1 != XML_DTD_NODE) {
      if (xVar1 == XML_HTML_DOCUMENT_NODE) goto LAB_0018299e;
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var7 = __xmlDeregisterNodeDefaultValue(), *pp_Var7 != (xmlDeregisterNodeFunc)0x0)) {
        pp_Var7 = __xmlDeregisterNodeDefaultValue();
        (**pp_Var7)(cur);
      }
      if ((((xmlDocPtr)cur)->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
         ((0x180002U >> (((xmlDocPtr)cur)->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0))
      {
        p_Var5 = ((xmlDocPtr)cur)->extSubset;
        while (p_Var5 != (_xmlDtd *)0x0) {
          p_Var4 = (_xmlDtd *)p_Var5->next;
          xmlFreeProp((xmlAttrPtr)p_Var5);
          p_Var5 = p_Var4;
        }
      }
      if ((((XML_XINCLUDE_END < ((xmlDocPtr)cur)->type) ||
           ((0x180022U >> (((xmlDocPtr)cur)->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0
           )) && (p_Var5 = ((xmlDocPtr)cur)->intSubset,
                 p_Var5 != (_xmlDtd *)0x0 && p_Var5 != (_xmlDtd *)&((xmlDocPtr)cur)->extSubset)) &&
         ((local_38 == (xmlDictPtr)0x0 ||
          (iVar6 = xmlDictOwns(local_38,(xmlChar *)p_Var5), iVar6 == 0)))) {
        (*xmlFree)(((xmlDocPtr)cur)->intSubset);
      }
      if (((((xmlDocPtr)cur)->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
          ((0x180002U >> (((xmlDocPtr)cur)->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)
          ) && (((xmlDocPtr)cur)->oldNs != (xmlNsPtr)0x0)) {
        xmlFreeNsList(((xmlDocPtr)cur)->oldNs);
      }
      if (((((xmlChar *)((xmlDocPtr)cur)->name != (xmlChar *)0x0) &&
           (((xmlDocPtr)cur)->type != XML_TEXT_NODE)) &&
          (((xmlDocPtr)cur)->type != XML_COMMENT_NODE)) &&
         ((local_38 == (xmlDictPtr)0x0 ||
          (iVar6 = xmlDictOwns(local_38,(xmlChar *)((xmlDocPtr)cur)->name), iVar6 == 0)))) {
        (*xmlFree)(((xmlDocPtr)cur)->name);
      }
      (*xmlFree)(cur);
    }
    cur = (xmlNodePtr)pxVar2;
    if (pxVar2 == (xmlDocPtr)0x0) {
      if (lVar8 == 0) {
        return;
      }
      if (pxVar3 == (xmlDocPtr)0x0) {
        return;
      }
      lVar8 = lVar8 + -1;
      pxVar3->children = (_xmlNode *)0x0;
      cur = (xmlNodePtr)pxVar3;
    }
  } while( true );
}

Assistant:

void
xmlFreeNodeList(xmlNodePtr cur) {
    xmlNodePtr next;
    xmlNodePtr parent;
    xmlDictPtr dict = NULL;
    size_t depth = 0;

    if (cur == NULL) return;
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNsList((xmlNsPtr) cur);
	return;
    }
    if (cur->doc != NULL) dict = cur->doc->dict;
    while (1) {
        while ((cur->children != NULL) &&
               (cur->type != XML_DOCUMENT_NODE) &&
               (cur->type != XML_HTML_DOCUMENT_NODE) &&
               (cur->type != XML_DTD_NODE) &&
               (cur->type != XML_ENTITY_REF_NODE)) {
            cur = cur->children;
            depth += 1;
        }

        next = cur->next;
        parent = cur->parent;
	if ((cur->type == XML_DOCUMENT_NODE) ||
            (cur->type == XML_HTML_DOCUMENT_NODE)) {
            xmlFreeDoc((xmlDocPtr) cur);
        } else if (cur->type != XML_DTD_NODE) {

	    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
		xmlDeregisterNodeDefaultValue(cur);

	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->properties != NULL))
		xmlFreePropList(cur->properties);
	    if ((cur->type != XML_ELEMENT_NODE) &&
		(cur->type != XML_XINCLUDE_START) &&
		(cur->type != XML_XINCLUDE_END) &&
		(cur->type != XML_ENTITY_REF_NODE) &&
		(cur->content != (xmlChar *) &(cur->properties))) {
		DICT_FREE(cur->content)
	    }
	    if (((cur->type == XML_ELEMENT_NODE) ||
	         (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->nsDef != NULL))
		xmlFreeNsList(cur->nsDef);

	    /*
	     * When a node is a text node or a comment, it uses a global static
	     * variable for the name of the node.
	     * Otherwise the node name might come from the document's
	     * dictionary
	     */
	    if ((cur->name != NULL) &&
		(cur->type != XML_TEXT_NODE) &&
		(cur->type != XML_COMMENT_NODE))
		DICT_FREE(cur->name)
	    xmlFree(cur);
	}

        if (next != NULL) {
	    cur = next;
        } else {
            if ((depth == 0) || (parent == NULL))
                break;
            depth -= 1;
            cur = parent;
            cur->children = NULL;
        }
    }
}